

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_dpb.c
# Opt level: O0

int cmp_lt_list(void *p0,void *p1)

{
  H264eDpbFrm *frm1;
  H264eDpbFrm *frm0;
  void *p1_local;
  void *p0_local;
  
  if (*(int *)(*p0 + 0x24) == *(int *)(*p1 + 0x24)) {
    p0_local._4_4_ = 0;
  }
  else if (*(int *)(*p1 + 0x24) < *(int *)(*p0 + 0x24)) {
    p0_local._4_4_ = 1;
  }
  else {
    p0_local._4_4_ = -1;
  }
  return p0_local._4_4_;
}

Assistant:

static int cmp_lt_list(const void *p0, const void *p1)
{
    H264eDpbFrm *frm0 = *(H264eDpbFrm **)p0;
    H264eDpbFrm *frm1 = *(H264eDpbFrm **)p1;

    if (frm0->lt_idx == frm1->lt_idx)
        return 0;
    if (frm0->lt_idx > frm1->lt_idx)
        return 1;
    else
        return -1;
}